

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O3

Vector3<double> * __thiscall
OpenMD::SquareMatrix3<double>::toEulerAngles
          (Vector3<double> *__return_storage_ptr__,SquareMatrix3<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2];
  if (dVar1 <= -1.0) {
    dVar1 = -1.0;
  }
  if (1.0 <= dVar1) {
    dVar1 = 1.0;
  }
  dVar2 = acos(dVar1);
  dVar1 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2];
  dVar1 = 1.0 - dVar1 * dVar1;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  if (1e-06 <= ABS(dVar1)) {
    dVar1 = atan2((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0]
                  ,-(this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
                    [1]);
    dVar3 = atan2((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2]
                  ,(this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
                   [2]);
  }
  else {
    dVar1 = atan2(-(this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
                   [0],(this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                       [0][0]);
    dVar3 = 0.0;
  }
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] =
       (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar1 |
               (ulong)(dVar1 + 6.283185307179586) & -(ulong)(dVar1 < 0.0));
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = dVar2;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] =
       (double)(~-(ulong)(dVar3 < 0.0) & (ulong)dVar3 |
               (ulong)(dVar3 + 6.283185307179586) & -(ulong)(dVar3 < 0.0));
  return __return_storage_ptr__;
}

Assistant:

Vector3<Real> toEulerAngles() {
      Vector3<Real> myEuler;
      Real phi;
      Real theta;
      Real psi;
      Real ctheta;
      Real stheta;

      // set the tolerance for Euler angles and rotation elements

      theta = acos(
          std::min((RealType)1.0, std::max((RealType)-1.0, this->data_[2][2])));
      ctheta = this->data_[2][2];
      stheta = sqrt(1.0 - ctheta * ctheta);

      // when sin(theta) is close to 0, we need to consider
      // singularity In this case, we can assign an arbitary value to
      // phi (or psi), and then determine the psi (or phi) or
      // vice-versa. We'll assume that phi always gets the rotation,
      // and psi is 0 in cases of singularity.
      // we use atan2 instead of atan, since atan2 will give us -Pi to Pi.
      // Since 0 <= theta <= 180, sin(theta) will be always
      // non-negative. Therefore, it will never change the sign of both of
      // the parameters passed to atan2.

      if (fabs(stheta) < 1e-6) {
        psi = 0.0;
        phi = atan2(-this->data_[1][0], this->data_[0][0]);
      }
      // we only have one unique solution
      else {
        phi = atan2(this->data_[2][0], -this->data_[2][1]);
        psi = atan2(this->data_[0][2], this->data_[1][2]);
      }

      // wrap phi and psi, make sure they are in the range from 0 to 2*Pi
      if (phi < 0) phi += 2.0 * Constants::PI;

      if (psi < 0) psi += 2.0 * Constants::PI;

      myEuler[0] = phi;
      myEuler[1] = theta;
      myEuler[2] = psi;

      return myEuler;
    }